

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O0

void End(WebPWorker *worker)

{
  long *in_RDI;
  WebPWorkerImpl *impl;
  WebPWorkerStatus in_stack_ffffffffffffffec;
  pthread_mutex_t *__mutex;
  
  if (*in_RDI != 0) {
    __mutex = (pthread_mutex_t *)*in_RDI;
    ChangeState((WebPWorker *)&__mutex->__data,in_stack_ffffffffffffffec);
    pthread_join(*(pthread_t *)((long)__mutex + 0x58),(void **)0x0);
    pthread_mutex_destroy(__mutex);
    pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
    WebPSafeFree((void *)0x15aa41);
    *in_RDI = 0;
  }
  return;
}

Assistant:

static void End(WebPWorker* const worker) {
#ifdef WEBP_USE_THREAD
  if (worker->impl != NULL) {
    WebPWorkerImpl* const impl = (WebPWorkerImpl*)worker->impl;
    ChangeState(worker, NOT_OK);
    pthread_join(impl->thread, NULL);
    pthread_mutex_destroy(&impl->mutex);
    pthread_cond_destroy(&impl->condition);
    WebPSafeFree(impl);
    worker->impl = NULL;
  }
#else
  worker->status = NOT_OK;
  assert(worker->impl == NULL);
#endif
  assert(worker->status == NOT_OK);
}